

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O2

from_chars_result __thiscall semver::detail::lexer::scan_token(lexer *this,token_stream *stream)

{
  byte bVar1;
  bool bVar2;
  _Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator> in_AX;
  char *pcVar3;
  size_t sVar4;
  token_type type;
  from_chars_result fVar5;
  undefined8 uStackY_20;
  
  pcVar3 = (this->text_)._M_str;
  bVar1 = pcVar3[this->current_pos_];
  sVar4 = this->current_pos_ + 1;
  this->current_pos_ = sVar4;
  if (bVar1 == 0x7c) {
    bVar2 = advanceIfMatch(this,'|');
    if (!bVar2) {
      pcVar3 = (this->text_)._M_str + this->current_pos_;
LAB_00102a04:
      uStackY_20 = 0x16;
      goto LAB_001029cc;
    }
    type = logical_or;
  }
  else if (bVar1 == 0x2b) {
    type = plus;
  }
  else if (bVar1 == 0x2d) {
    type = hyphen;
  }
  else if (bVar1 == 0x2e) {
    type = dot;
  }
  else if (bVar1 == 0x3c) {
    advanceIfMatch(this,'=');
LAB_00102965:
    type = range_operator;
  }
  else if (bVar1 == 0x3d) {
    type = range_operator;
  }
  else {
    if (bVar1 == 0x3e) {
      advanceIfMatch(this,'=');
      goto LAB_00102965;
    }
    if (bVar1 == 0x20) {
      type = space;
    }
    else if ((byte)(bVar1 - 0x30) < 10) {
      type = digit;
    }
    else {
      if (0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) {
        pcVar3 = pcVar3 + sVar4;
        goto LAB_00102a04;
      }
      type = letter;
    }
  }
  add_token(this,stream,type,
            (value_t)in_AX.
                     super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                     .
                     super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                     .
                     super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                     .
                     super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
           );
  pcVar3 = (this->text_)._M_str + this->current_pos_;
  uStackY_20 = 0;
LAB_001029cc:
  fVar5.super_from_chars_result.ptr = pcVar3 + -1;
  fVar5.super_from_chars_result._8_8_ = uStackY_20;
  return (from_chars_result)fVar5.super_from_chars_result;
}

Assistant:

scan_token(token_stream& stream) noexcept {
    const char c = advance();

    switch (c) {
    case ' ':
      add_token(stream, token_type::space);
      break;
    case '.':
      add_token(stream, token_type::dot);
      break;
    case '-':
      add_token(stream, token_type::hyphen);
      break;
    case '+':
      add_token(stream, token_type::plus);
      break;
    case '|':
      if (advanceIfMatch('|')) {
        add_token(stream, token_type::logical_or);
        break;
      }
      return failure(get_prev_symbol());
    case '<':
      add_token(stream, token_type::range_operator, advanceIfMatch('=') ? range_operator::less_or_equal : range_operator::less);
      break;
    case '>':
      add_token(stream, token_type::range_operator, advanceIfMatch('=') ? range_operator::greater_or_equal : range_operator::greater);
      break;
    case '=':
      add_token(stream, token_type::range_operator, range_operator::equal);
      break;
    default:
      if (is_digit(c)) {
        add_token(stream, token_type::digit, to_digit(c));
        break;
      }
      else if (is_letter(c)) {
        add_token(stream, token_type::letter, c);
        break;
      }
      return failure(get_prev_symbol());
    }

    return success(get_prev_symbol());
  }